

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O3

void __thiscall curlpp::internal::OptionList::setOpt(OptionList *this,OptionBase *option)

{
  CURLoption CVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  iterator __position;
  pair<CURLoption,_curlpp::OptionBase_*> local_30;
  
  CVar1 = OptionBase::getOption(option);
  p_Var2 = (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var3 = &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var3->_M_header;
    do {
      if ((int)CVar1 <= (int)p_Var2[1]._M_color) {
        __position._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)CVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var3) &&
       ((int)__position._M_node[1]._M_color <= (int)CVar1)) {
      if (__position._M_node[1]._M_parent != (_Base_ptr)0x0) {
        (**(code **)(*(long *)__position._M_node[1]._M_parent + 8))();
      }
      std::
      _Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
      ::erase_abi_cxx11_((_Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
                          *)&this->mOptions,__position);
    }
  }
  local_30.first = OptionBase::getOption(option);
  local_30.second = option;
  std::
  _Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
  ::_M_emplace_unique<std::pair<CURLoption,curlpp::OptionBase*>>
            ((_Rb_tree<CURLoption,std::pair<CURLoption_const,curlpp::OptionBase*>,std::_Select1st<std::pair<CURLoption_const,curlpp::OptionBase*>>,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
              *)&this->mOptions,&local_30);
  return;
}

Assistant:

void OptionList::setOpt(curlpp::OptionBase * option)
{
   mapType::iterator pos = mOptions.find(option->getOption());
   if(pos != mOptions.end())
   {
      delete (*pos).second;
      mOptions.erase(pos);	
   }
   mOptions.insert(std::make_pair(option->getOption(), option));
}